

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::reserve(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          *this,size_type n,size_type avg_size,size_type max_align)

{
  size_type sVar1;
  length_error *this_00;
  pair<unsigned_long,_unsigned_long> pVar2;
  
  pVar2 = capacities(this);
  if (n <= pVar2.first) {
    pVar2 = capacities(this);
    if ((avg_size <= pVar2.second) && (max_align <= this->_align_max)) {
      return;
    }
  }
  sVar1 = max_size(this);
  if (n <= sVar1) {
    vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
    ::increase_storage<std::integral_constant<bool,false>>
              ((vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
                *)this,n,avg_size,max_align);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"poly::vector reserve size too big");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

inline void vector<I, A, C>::reserve(size_type n, size_type avg_size, size_type max_align)
{
    using copy = std::conditional_t<interface_type_noexcept_movable::value, std::false_type,
        std::true_type>;
    if (n <= capacities().first && avg_size <= capacities().second && _align_max >= max_align) {
        return;
    }
    if (n > max_size()) {
        throw std::length_error("poly::vector reserve size too big");
    }
    increase_storage(n, avg_size, max_align, copy {});
}